

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_avx2.c
# Opt level: O0

void array_reverse_transpose_8x8_avx2(__m256i *in,__m256i *res)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  __m256i tr1_7;
  __m256i tr1_6;
  __m256i tr1_5;
  __m256i tr1_4;
  __m256i tr1_3;
  __m256i tr1_2;
  __m256i tr1_1;
  __m256i tr1_0;
  __m256i tr0_7;
  __m256i tr0_6;
  __m256i tr0_5;
  __m256i tr0_4;
  __m256i tr0_3;
  __m256i tr0_2;
  __m256i tr0_1;
  __m256i tr0_0;
  
  auVar5 = vpunpcklwd_avx2(*in_RDI,in_RDI[1]);
  auVar6 = vpunpcklwd_avx2(in_RDI[2],in_RDI[3]);
  auVar1 = vpunpckhwd_avx2(*in_RDI,in_RDI[1]);
  auVar2 = vpunpckhwd_avx2(in_RDI[2],in_RDI[3]);
  auVar7 = vpunpcklwd_avx2(in_RDI[4],in_RDI[5]);
  auVar8 = vpunpcklwd_avx2(in_RDI[6],in_RDI[7]);
  auVar3 = vpunpckhwd_avx2(in_RDI[4],in_RDI[5]);
  auVar4 = vpunpckhwd_avx2(in_RDI[6],in_RDI[7]);
  auVar9 = vpunpckldq_avx2(auVar5,auVar6);
  auVar10 = vpunpckldq_avx2(auVar7,auVar8);
  auVar5 = vpunpckhdq_avx2(auVar5,auVar6);
  auVar6 = vpunpckhdq_avx2(auVar7,auVar8);
  auVar7 = vpunpckldq_avx2(auVar1,auVar2);
  auVar8 = vpunpckldq_avx2(auVar3,auVar4);
  auVar1 = vpunpckhdq_avx2(auVar1,auVar2);
  auVar2 = vpunpckhdq_avx2(auVar3,auVar4);
  auVar3 = vpunpcklqdq_avx2(auVar9,auVar10);
  in_RSI[7] = auVar3;
  auVar3 = vpunpckhqdq_avx2(auVar9,auVar10);
  in_RSI[6] = auVar3;
  auVar3 = vpunpcklqdq_avx2(auVar5,auVar6);
  in_RSI[5] = auVar3;
  auVar3 = vpunpckhqdq_avx2(auVar5,auVar6);
  in_RSI[4] = auVar3;
  auVar3 = vpunpcklqdq_avx2(auVar7,auVar8);
  in_RSI[3] = auVar3;
  auVar3 = vpunpckhqdq_avx2(auVar7,auVar8);
  in_RSI[2] = auVar3;
  auVar3 = vpunpcklqdq_avx2(auVar1,auVar2);
  in_RSI[1] = auVar3;
  auVar1 = vpunpckhqdq_avx2(auVar1,auVar2);
  *in_RSI = auVar1;
  return;
}

Assistant:

static inline void array_reverse_transpose_8x8_avx2(__m256i *in, __m256i *res) {
  const __m256i tr0_0 = _mm256_unpacklo_epi16(in[0], in[1]);
  const __m256i tr0_1 = _mm256_unpacklo_epi16(in[2], in[3]);
  const __m256i tr0_2 = _mm256_unpackhi_epi16(in[0], in[1]);
  const __m256i tr0_3 = _mm256_unpackhi_epi16(in[2], in[3]);
  const __m256i tr0_4 = _mm256_unpacklo_epi16(in[4], in[5]);
  const __m256i tr0_5 = _mm256_unpacklo_epi16(in[6], in[7]);
  const __m256i tr0_6 = _mm256_unpackhi_epi16(in[4], in[5]);
  const __m256i tr0_7 = _mm256_unpackhi_epi16(in[6], in[7]);

  const __m256i tr1_0 = _mm256_unpacklo_epi32(tr0_0, tr0_1);
  const __m256i tr1_1 = _mm256_unpacklo_epi32(tr0_4, tr0_5);
  const __m256i tr1_2 = _mm256_unpackhi_epi32(tr0_0, tr0_1);
  const __m256i tr1_3 = _mm256_unpackhi_epi32(tr0_4, tr0_5);
  const __m256i tr1_4 = _mm256_unpacklo_epi32(tr0_2, tr0_3);
  const __m256i tr1_5 = _mm256_unpacklo_epi32(tr0_6, tr0_7);
  const __m256i tr1_6 = _mm256_unpackhi_epi32(tr0_2, tr0_3);
  const __m256i tr1_7 = _mm256_unpackhi_epi32(tr0_6, tr0_7);

  res[7] = _mm256_unpacklo_epi64(tr1_0, tr1_1);
  res[6] = _mm256_unpackhi_epi64(tr1_0, tr1_1);
  res[5] = _mm256_unpacklo_epi64(tr1_2, tr1_3);
  res[4] = _mm256_unpackhi_epi64(tr1_2, tr1_3);
  res[3] = _mm256_unpacklo_epi64(tr1_4, tr1_5);
  res[2] = _mm256_unpackhi_epi64(tr1_4, tr1_5);
  res[1] = _mm256_unpacklo_epi64(tr1_6, tr1_7);
  res[0] = _mm256_unpackhi_epi64(tr1_6, tr1_7);
}